

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

CacheEntryType cmState::StringToCacheEntryType(char *s)

{
  int iVar1;
  CacheEntryType CVar2;
  CacheEntryType CVar3;
  char **ppcVar4;
  
  CVar3 = BOOL;
  ppcVar4 = cmCacheEntryTypes;
  while ((CVar2 = STRING, *ppcVar4 != (char *)0x0 &&
         (iVar1 = strcmp(s,*ppcVar4), CVar2 = CVar3, iVar1 != 0))) {
    CVar3 = CVar3 + PATH;
    ppcVar4 = ppcVar4 + 1;
  }
  return CVar2;
}

Assistant:

cmStateEnums::CacheEntryType cmState::StringToCacheEntryType(const char* s)
{
  int i = 0;
  while (cmCacheEntryTypes[i]) {
    if (strcmp(s, cmCacheEntryTypes[i]) == 0) {
      return static_cast<cmStateEnums::CacheEntryType>(i);
    }
    ++i;
  }
  return cmStateEnums::STRING;
}